

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

string * cmInstallTargetGenerator::GetInstallFilename
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *config,
                   NameType nameType)

{
  bool bVar1;
  TargetType TVar2;
  Names targetNames;
  Names local_f0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames(&local_f0,target,config);
    if (((nameType == NameReal) || (nameType != NameImplib)) ||
       (bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                          (target,config,&local_f0.ImportLibrary,__return_storage_ptr__,
                           "${CMAKE_IMPORT_LIBRARY_SUFFIX}"), !bVar1)) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  else {
    cmGeneratorTarget::GetLibraryNames(&local_f0,target,config);
    if (((nameType == NameReal) || (nameType == NameSO)) ||
       ((nameType != NameImplib ||
        (bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                           (target,config,&local_f0.ImportLibrary,__return_storage_ptr__,
                            "${CMAKE_IMPORT_LIBRARY_SUFFIX}"), !bVar1)))) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.SharedObject._M_dataplus._M_p != &local_f0.SharedObject.field_2) {
    operator_delete(local_f0.SharedObject._M_dataplus._M_p,
                    local_f0.SharedObject.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.PDB._M_dataplus._M_p != &local_f0.PDB.field_2) {
    operator_delete(local_f0.PDB._M_dataplus._M_p,local_f0.PDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.ImportLibrary._M_dataplus._M_p != &local_f0.ImportLibrary.field_2) {
    operator_delete(local_f0.ImportLibrary._M_dataplus._M_p,
                    local_f0.ImportLibrary.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.Real._M_dataplus._M_p != &local_f0.Real.field_2) {
    operator_delete(local_f0.Real._M_dataplus._M_p,local_f0.Real.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.Output._M_dataplus._M_p != &local_f0.Output.field_2) {
    operator_delete(local_f0.Output._M_dataplus._M_p,
                    local_f0.Output.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.Base._M_dataplus._M_p != &local_f0.Base.field_2) {
    operator_delete(local_f0.Base._M_dataplus._M_p,local_f0.Base.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetInstallFilename(
  cmGeneratorTarget const* target, const std::string& config,
  NameType nameType)
{
  std::string fname;
  // Compute the name of the library.
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    cmGeneratorTarget::Names targetNames = target->GetExecutableNames(config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportLibrary, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportLibrary;
      }
    } else if (nameType == NameReal) {
      // Use the canonical name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  } else {
    cmGeneratorTarget::Names targetNames = target->GetLibraryNames(config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportLibrary, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportLibrary;
      }
    } else if (nameType == NameSO) {
      // Use the soname.
      fname = targetNames.SharedObject;
    } else if (nameType == NameReal) {
      // Use the real name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  }

  return fname;
}